

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O1

int cmExecuteCommand(void *arg,char *name,int numArgs,char **args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ulong uVar3;
  cmListFileFunction lff;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> lffArgs;
  cmExecutionStatus status;
  allocator<char> local_12a;
  undefined1 local_129;
  cmListFileFunction local_128;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_118;
  cmMakefile *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_d0;
  bool local_b0;
  cmExecutionStatus local_a8;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_58;
  long local_40 [2];
  
  local_118.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8 = (cmMakefile *)arg;
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::reserve
            (&local_118,(long)numArgs);
  if (0 < numArgs) {
    uVar3 = (ulong)(uint)numArgs;
    do {
      local_a8.Makefile = (cmMakefile *)CONCAT44(local_a8.Makefile._4_4_,1);
      local_128.Impl.
      super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)
               ((ulong)local_128.Impl.
                       super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr & 0xffffffff00000000);
      std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
      emplace_back<char_const*&,cmListFileArgument::Delimiter,int>
                ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)&local_118,args,
                 (Delimiter *)&local_a8,(int *)&local_128);
      args = args + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,name,&local_12a);
  local_58.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_118.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_58.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_118.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_58.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_118.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  local_118.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40[1] = 0;
  local_40[0] = 0;
  local_a8.Makefile = (cmMakefile *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cmListFileFunction::Implementation,std::allocator<cmListFileFunction::Implementation>,std::__cxx11::string,long&,long&,std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8.Error,
             (Implementation **)&local_a8,
             (allocator<cmListFileFunction::Implementation> *)&local_129,&local_f0,local_40 + 1,
             local_40,&local_58);
  local_128.Impl.
  super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_a8.Makefile;
  local_128.Impl.
  super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.Error._M_dataplus._M_p;
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_a8.Error.field_2;
  local_a8.Makefile = local_f8;
  local_a8.Error.field_2._M_allocated_capacity._0_6_ = 0x776f6e6b6e75;
  local_a8.Error.field_2._M_allocated_capacity._6_2_ = 0x206e;
  local_a8.Error.field_2._8_6_ = 0x2e726f727265;
  local_a8.Error._M_string_length = 0xe;
  local_a8.Error.field_2._M_local_buf[0xe] = '\0';
  local_a8.ExitCode.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = false;
  local_a8.Variables.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.Variables.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.Variables.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.ReturnInvoked = false;
  local_a8.BreakInvoked = false;
  local_a8.ContinueInvoked = false;
  local_a8.NestedError = false;
  local_b0 = false;
  local_a8.Error._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = cmMakefile::ExecuteCommand
                    (local_f8,&local_128,&local_a8,
                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_d0);
  if (local_b0 == true) {
    local_b0 = false;
    if (local_d0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_d0._M_value + 0x10)) {
      operator_delete((void *)local_d0._M_value._M_dataplus._M_p,local_d0._16_8_ + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.Variables);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.Error._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.Error._M_dataplus._M_p,
                    CONCAT26(local_a8.Error.field_2._M_allocated_capacity._6_2_,
                             local_a8.Error.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if (local_128.Impl.
      super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.Impl.
               super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_118);
  return (uint)bVar2;
}

Assistant:

static int CCONV cmExecuteCommand(void* arg, const char* name, int numArgs,
                                  const char** args)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);

  std::vector<cmListFileArgument> lffArgs;
  lffArgs.reserve(numArgs);
  for (int i = 0; i < numArgs; ++i) {
    // Assume all arguments are quoted.
    lffArgs.emplace_back(args[i], cmListFileArgument::Quoted, 0);
  }

  cmListFileFunction lff{ name, 0, 0, std::move(lffArgs) };
  cmExecutionStatus status(*mf);
  return mf->ExecuteCommand(lff, status);
}